

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c,SUNMatrix A)

{
  int sparsetype;
  sunindextype *psVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  void *__dest;
  SUNMatrix A_00;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  
  psVar1 = (sunindextype *)A->content;
  sparsetype = (int)psVar1[5];
  lVar16 = psVar1[sparsetype == 0];
  lVar11 = psVar1[sparsetype != 0];
  lVar14 = lVar16;
  if (lVar11 < lVar16) {
    lVar14 = lVar11;
  }
  if (0 < lVar14) {
    plVar2 = (long *)psVar1[7];
    lVar3 = psVar1[6];
    lVar4 = psVar1[4];
    lVar10 = 0;
    lVar21 = 0;
    lVar15 = *plVar2;
    do {
      lVar18 = plVar2[lVar10 + 1];
      uVar20 = 1;
      if (lVar15 < lVar18) {
        if (*(long *)(lVar3 + lVar15 * 8) == lVar10) {
          uVar20 = 0;
        }
        else {
          do {
            lVar15 = lVar15 + 1;
            if (lVar18 == lVar15) break;
          } while (*(long *)(lVar3 + lVar15 * 8) != lVar10);
          uVar20 = (ulong)(lVar18 <= lVar15);
        }
      }
      lVar21 = lVar21 + uVar20;
      lVar10 = lVar10 + 1;
      lVar15 = lVar18;
    } while (lVar10 != lVar14);
    if (lVar21 == 0) {
      if (0 < lVar14) {
        lVar11 = 0;
        lVar16 = *plVar2;
        do {
          lVar21 = plVar2[lVar11 + 1];
          if (lVar16 < lVar21) {
            do {
              dVar22 = *(double *)(lVar4 + lVar16 * 8) * c;
              dVar23 = dVar22 + 1.0;
              if (*(long *)(lVar3 + lVar16 * 8) != lVar11) {
                dVar23 = dVar22;
              }
              *(double *)(lVar4 + lVar16 * 8) = dVar23;
              lVar16 = lVar16 + 1;
            } while (lVar21 != lVar16);
          }
          lVar11 = lVar11 + 1;
          lVar16 = lVar21;
        } while (lVar11 != lVar14);
      }
    }
    else {
      uVar20 = plVar2[lVar16];
      lVar14 = psVar1[2];
      __dest = malloc(lVar11 * 8);
      if ((long)(lVar14 - uVar20) < lVar21) {
        A_00 = SUNSparseMatrix(*psVar1,psVar1[1],uVar20 + lVar21,sparsetype,A->sunctx);
        pvVar8 = A_00->content;
        lVar14 = *(long *)((long)pvVar8 + 0x38);
        lVar21 = *(long *)((long)pvVar8 + 0x20);
        if (lVar16 < 1) {
          lVar15 = 0;
        }
        else {
          lVar10 = *(long *)((long)pvVar8 + 0x30);
          lVar15 = 0;
          lVar18 = 0;
          do {
            *(long *)(lVar14 + lVar18 * 8) = lVar15;
            *(undefined8 *)((long)__dest + lVar18 * 8) = 0;
            lVar17 = plVar2[lVar18];
            lVar12 = plVar2[lVar18 + 1];
            lVar19 = lVar17;
            if (lVar17 < lVar12) {
              do {
                *(double *)((long)__dest + *(long *)(lVar3 + lVar19 * 8) * 8) =
                     *(double *)(lVar4 + lVar19 * 8) * c;
                lVar19 = lVar19 + 1;
              } while (lVar12 != lVar19);
            }
            if (lVar18 < lVar11) {
              *(double *)((long)__dest + lVar18 * 8) = *(double *)((long)__dest + lVar18 * 8) + 1.0;
            }
            lVar19 = lVar18 + 1;
            if (lVar17 < lVar12) {
              lVar5 = *(long *)(lVar3 + lVar17 * 8);
              while (lVar5 < lVar18) {
                lVar17 = lVar17 + 1;
                *(long *)(lVar10 + lVar15 * 8) = lVar5;
                *(undefined8 *)(lVar21 + lVar15 * 8) =
                     *(undefined8 *)((long)__dest + *(long *)(lVar3 + -8 + lVar17 * 8) * 8);
                lVar15 = lVar15 + 1;
                lVar12 = plVar2[lVar19];
                if (lVar12 <= lVar17) goto LAB_001312b4;
                lVar5 = *(long *)(lVar3 + lVar17 * 8);
              }
              if (lVar5 != lVar18) goto LAB_001312b4;
            }
            else {
LAB_001312b4:
              *(long *)(lVar10 + lVar15 * 8) = lVar18;
              *(undefined8 *)(lVar21 + lVar15 * 8) = *(undefined8 *)((long)__dest + lVar18 * 8);
              lVar15 = lVar15 + 1;
              lVar12 = plVar2[lVar19];
            }
            if (lVar17 < lVar12) {
              do {
                lVar18 = *(long *)(lVar3 + lVar17 * 8);
                *(long *)(lVar10 + lVar15 * 8) = lVar18;
                *(undefined8 *)(lVar21 + lVar15 * 8) = *(undefined8 *)((long)__dest + lVar18 * 8);
                lVar15 = lVar15 + 1;
                lVar17 = lVar17 + 1;
              } while (lVar17 < plVar2[lVar19]);
            }
            lVar18 = lVar19;
          } while (lVar19 != lVar16);
        }
        *(long *)(lVar14 + lVar16 * 8) = lVar15;
        pvVar13 = A->content;
        *(undefined8 *)((long)pvVar13 + 0x10) = *(undefined8 *)((long)pvVar8 + 0x10);
        if (*(void **)((long)pvVar13 + 0x20) != (void *)0x0) {
          free(*(void **)((long)pvVar13 + 0x20));
          pvVar8 = A_00->content;
          lVar21 = *(long *)((long)pvVar8 + 0x20);
          pvVar13 = A->content;
        }
        *(long *)((long)pvVar13 + 0x20) = lVar21;
        *(undefined8 *)((long)pvVar8 + 0x20) = 0;
        if (*(void **)((long)pvVar13 + 0x30) != (void *)0x0) {
          free(*(void **)((long)pvVar13 + 0x30));
          pvVar8 = A_00->content;
          pvVar13 = A->content;
        }
        *(undefined8 *)((long)pvVar13 + 0x30) = *(undefined8 *)((long)pvVar8 + 0x30);
        *(undefined8 *)((long)pvVar8 + 0x30) = 0;
        if (*(void **)((long)pvVar13 + 0x38) != (void *)0x0) {
          free(*(void **)((long)pvVar13 + 0x38));
          pvVar8 = A_00->content;
          pvVar13 = A->content;
        }
        *(undefined8 *)((long)pvVar13 + 0x38) = *(undefined8 *)((long)pvVar8 + 0x38);
        *(undefined8 *)((long)pvVar8 + 0x38) = 0;
        SUNMatDestroy_Sparse(A_00);
        pvVar8 = __dest;
      }
      else {
        pvVar8 = malloc(lVar11 * 8);
        lVar21 = lVar21 + uVar20;
        plVar2[lVar16] = lVar21;
        if (0 < lVar16) {
LAB_001313a0:
          *(undefined8 *)((long)pvVar8 + lVar16 * 8 + -8) = 0;
          uVar6 = plVar2[lVar16 + -1];
          lVar14 = uVar20 - uVar6;
          if (lVar14 != 0 && (long)uVar6 <= (long)uVar20) {
            memcpy(__dest,(void *)(uVar6 * 8 + lVar3),(uVar20 - uVar6) * 8);
            uVar9 = uVar6;
            do {
              *(double *)((long)pvVar8 + *(long *)(lVar3 + uVar9 * 8) * 8) =
                   *(double *)(lVar4 + uVar9 * 8) * c;
              uVar9 = uVar9 + 1;
            } while (uVar20 != uVar9);
          }
          lVar15 = lVar16 + -1;
          if (lVar16 <= lVar11) {
            *(double *)((long)pvVar8 + lVar15 * 8) = *(double *)((long)pvVar8 + lVar15 * 8) + 1.0;
          }
          if (-1 < (long)(~uVar6 + uVar20)) {
            lVar10 = lVar4 + -8 + lVar21 * 8;
            lVar18 = lVar3 + -8 + lVar21 * 8;
            lVar12 = 0;
            lVar17 = lVar14;
LAB_00131465:
            lVar19 = *(long *)((long)__dest + lVar12 * 8 + uVar20 * 8 + uVar6 * -8 + -8);
            if (lVar16 <= lVar19) goto code_r0x0013146e;
            if (lVar19 == lVar15) {
              lVar14 = lVar21 + lVar12;
            }
            else {
              lVar14 = lVar12 + lVar21 + -1;
              *(long *)(lVar18 + lVar12 * 8) = lVar15;
              *(undefined8 *)(lVar10 + lVar12 * 8) = *(undefined8 *)((long)pvVar8 + lVar15 * 8);
            }
            do {
              lVar10 = *(long *)((long)__dest + lVar17 * 8 + -8);
              lVar21 = lVar14 + -1;
              *(long *)(lVar3 + -8 + lVar14 * 8) = lVar10;
              *(undefined8 *)(lVar4 + -8 + lVar14 * 8) = *(undefined8 *)((long)pvVar8 + lVar10 * 8);
              lVar17 = lVar17 + -1;
              lVar14 = lVar21;
            } while (lVar17 != 0);
            goto LAB_00131508;
          }
          goto LAB_0013149c;
        }
LAB_0013151d:
        free(__dest);
      }
      free(pvVar8);
    }
  }
  return 0;
code_r0x0013146e:
  *(long *)(lVar18 + lVar12 * 8) = lVar19;
  *(undefined8 *)(lVar10 + lVar12 * 8) = *(undefined8 *)((long)pvVar8 + lVar19 * 8);
  lVar19 = lVar14 + lVar12;
  lVar12 = lVar12 + -1;
  lVar17 = lVar17 + -1;
  if (lVar19 == 1 || lVar19 + -1 < 0) goto code_r0x0013148f;
  goto LAB_00131465;
code_r0x0013148f:
  lVar21 = lVar21 + lVar12;
LAB_0013149c:
  *(long *)(lVar3 + -8 + lVar21 * 8) = lVar15;
  *(undefined8 *)(lVar4 + -8 + lVar21 * 8) = *(undefined8 *)((long)pvVar8 + lVar15 * 8);
  lVar21 = lVar21 + -1;
LAB_00131508:
  uVar20 = plVar2[lVar15];
  plVar2[lVar15] = lVar21;
  bVar7 = lVar16 < 2;
  lVar16 = lVar15;
  if (bVar7) goto LAB_0013151d;
  goto LAB_001313a0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c, SUNMatrix A)
{
  sunindextype j, i, p, nz, newvals, M, N, cend, nw;
  sunbooleantype newmat, found;
  sunindextype *w, *Ap, *Ai, *Cp, *Ci;
  sunrealtype *x, *Ax, *Cx;
  SUNMatrix C;
  SUNFunctionBegin(A->sunctx);

  /* store shortcuts to matrix dimensions (M is inner dimension, N is outer) */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    M = SM_ROWS_S(A);
    N = SM_COLUMNS_S(A);
  }
  else
  {
    M = SM_COLUMNS_S(A);
    N = SM_ROWS_S(A);
  }

  /* access data arrays from A */
  Ap = NULL;
  Ai = NULL;
  Ax = NULL;
  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  /* determine if A: contains values on the diagonal (so I can just be added
     in); if not, then increment counter for extra storage that should be
     required. */
  newvals = 0;
  for (j = 0; j < SUNMIN(M, N); j++)
  {
    /* scan column (row if CSR) of A, searching for diagonal value */
    found = SUNFALSE;
    for (i = Ap[j]; i < Ap[j + 1]; i++)
    {
      if (Ai[i] == j)
      {
        found = SUNTRUE;
        break;
      }
    }
    /* if no diagonal found, increment necessary storage counter */
    if (!found) { newvals += 1; }
  }

  /* If extra nonzeros required, check whether matrix has sufficient storage
     space for new nonzero entries  (so I can be inserted into existing storage)
   */
  newmat = SUNFALSE; /* no reallocation needed */
  if (newvals > (SM_NNZ_S(A) - Ap[N])) { newmat = SUNTRUE; }

  /* perform operation based on existing/necessary structure */

  /*   case 1: A already contains a diagonal */
  if (newvals == 0)
  {
    /* iterate through columns, adding 1.0 to diagonal */
    for (j = 0; j < SUNMIN(M, N); j++)
    {
      for (i = Ap[j]; i < Ap[j + 1]; i++)
      {
        if (Ai[i] == j) { Ax[i] = ONE + c * Ax[i]; }
        else { Ax[i] = c * Ax[i]; }
      }
    }

    /*   case 2: A has sufficient storage, but does not already contain a
     * diagonal */
  }
  else if (!newmat)
  {
    /* create work arrays for nonzero row (column) indices and values in a
     * single column (row) */
    w = (sunindextype*)malloc(M * sizeof(sunindextype));
    SUNAssert(w, SUN_ERR_MALLOC_FAIL);
    x = (sunrealtype*)malloc(M * sizeof(sunrealtype));
    SUNAssert(x, SUN_ERR_MALLOC_FAIL);

    /* determine storage location where last column (row) should end */
    nz = Ap[N] + newvals;

    /* store pointer past last column (row) from original A,
       and store updated value in revised A */
    cend  = Ap[N];
    Ap[N] = nz;

    /* iterate through columns (rows) backwards */
    for (j = N - 1; j >= 0; j--)
    {
      /* reset diagonal entry, in case it's not in A */
      x[j] = ZERO;

      /* iterate down column (row) of A, collecting nonzeros */
      for (p = Ap[j], i = 0; p < cend; p++, i++)
      {
        w[i]     = Ai[p];     /* collect row (column) index */
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* NNZ in this column (row) */
      nw = cend - Ap[j];

      /* add identity to this column (row) */
      if (j < M) { x[j] += ONE; /* update value */ }

      /* fill entries of A with this column's (row's) data */
      /* fill entries past diagonal */
      for (i = nw - 1; i >= 0 && w[i] > j; i--)
      {
        Ai[--nz] = w[i];
        Ax[nz]   = x[w[i]];
      }
      /* fill diagonal if applicable */
      if (i < 0 /* empty or insert at front */ ||
          w[i] != j /* insert behind front */)
      {
        Ai[--nz] = j;
        Ax[nz]   = x[j];
      }
      /* fill entries before diagonal */
      for (; i >= 0; i--)
      {
        Ai[--nz] = w[i];
        Ax[nz]   = x[w[i]];
      }

      /* store ptr past this col (row) from orig A, update value for new A */
      cend  = Ap[j];
      Ap[j] = nz;
    }

    /* clean up */
    free(w);
    free(x);

    /*   case 3: A must be reallocated with sufficient storage */
  }
  else
  {
    /* create work array for nonzero values in a single column (row) */
    x = (sunrealtype*)malloc(M * sizeof(sunrealtype));

    /* create new matrix for sum */
    C = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A), Ap[N] + newvals,
                        SM_SPARSETYPE_S(A), A->sunctx);
    SUNCheckLastErr();

    /* access data from CSR structures (return if failure) */
    Cp = NULL;
    Ci = NULL;
    Cx = NULL;
    Cp = SM_INDEXPTRS_S(C);
    SUNAssert(Cp, SUN_ERR_ARG_CORRUPT);
    Ci = SM_INDEXVALS_S(C);
    SUNAssert(Ci, SUN_ERR_ARG_CORRUPT);
    Cx = SM_DATA_S(C);
    SUNAssert(Cx, SUN_ERR_ARG_CORRUPT);

    /* initialize total nonzero count */
    nz = 0;

    /* iterate through columns (rows for CSR) */
    for (j = 0; j < N; j++)
    {
      /* set current column (row) pointer to current # nonzeros */
      Cp[j] = nz;

      /* reset diagonal entry, in case it's not in A */
      x[j] = ZERO;

      /* iterate down column (along row) of A, collecting nonzeros */
      for (p = Ap[j]; p < Ap[j + 1]; p++)
      {
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* add identity to this column (row) */
      if (j < M) { x[j] += ONE; /* update value */ }

      /* fill entries of C with this column's (row's) data */
      /* fill entries before diagonal */
      for (p = Ap[j]; p < Ap[j + 1] && Ai[p] < j; p++)
      {
        Ci[nz]   = Ai[p];
        Cx[nz++] = x[Ai[p]];
      }
      /* fill diagonal if applicable */
      if (p >= Ap[j + 1] /* empty or insert at end */ ||
          Ai[p] != j /* insert before end */)
      {
        Ci[nz]   = j;
        Cx[nz++] = x[j];
      }
      /* fill entries past diagonal */
      for (; p < Ap[j + 1]; p++)
      {
        Ci[nz]   = Ai[p];
        Cx[nz++] = x[Ai[p]];
      }
    }

    /* indicate end of data */
    Cp[N] = nz;

    /* update A's structure with C's values; nullify C's pointers */
    SM_NNZ_S(A) = SM_NNZ_S(C);

    if (SM_DATA_S(A)) { free(SM_DATA_S(A)); }
    SM_DATA_S(A) = SM_DATA_S(C);
    SM_DATA_S(C) = NULL;

    if (SM_INDEXVALS_S(A)) { free(SM_INDEXVALS_S(A)); }
    SM_INDEXVALS_S(A) = SM_INDEXVALS_S(C);
    SM_INDEXVALS_S(C) = NULL;

    if (SM_INDEXPTRS_S(A)) { free(SM_INDEXPTRS_S(A)); }
    SM_INDEXPTRS_S(A) = SM_INDEXPTRS_S(C);
    SM_INDEXPTRS_S(C) = NULL;

    /* clean up */
    SUNMatDestroy_Sparse(C);
    free(x);
  }
  return SUN_SUCCESS;
}